

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV3RotAnimationBlock(Parser *this,Animation *anim)

{
  byte bVar1;
  iterator __position;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *__s2;
  pointer paVar5;
  float fVar6;
  float fVar7;
  ai_real f;
  uint iIndex;
  int local_9c;
  float local_90;
  uint local_8c;
  aiQuatKey local_88;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *local_70;
  float local_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_70 = &anim->akeyRotations;
  __s2 = (byte *)this->filePtr;
  local_9c = 0;
  do {
    bVar1 = *__s2;
    if (bVar1 == 0x2a) {
      pbVar4 = __s2 + 1;
      this->filePtr = (char *)pbVar4;
      iVar3 = strncmp("CONTROL_ROT_SAMPLE",(char *)pbVar4,0x12);
      if (iVar3 == 0) {
        bVar1 = __s2[0x13];
        bVar2 = false;
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar4 = __s2 + 0x14;
          if (bVar1 == 0) {
            pbVar4 = __s2 + 0x13;
          }
          this->filePtr = (char *)pbVar4;
          anim->mRotationType = TRACK;
          bVar2 = true;
          pbVar4 = (byte *)this->filePtr;
        }
      }
      else {
        bVar2 = false;
      }
      __s2 = pbVar4;
      iVar3 = strncmp("CONTROL_BEZIER_ROT_KEY",(char *)__s2,0x16);
      if (iVar3 == 0) {
        bVar1 = __s2[0x16];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar4 = __s2 + 0x17;
          if (bVar1 == 0) {
            pbVar4 = __s2 + 0x16;
          }
          this->filePtr = (char *)pbVar4;
          anim->mRotationType = BEZIER;
          __s2 = (byte *)this->filePtr;
          bVar2 = true;
        }
      }
      iVar3 = strncmp("CONTROL_TCB_ROT_KEY",(char *)__s2,0x13);
      if (iVar3 == 0) {
        bVar1 = __s2[0x13];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
        goto LAB_003e874a;
        pbVar4 = __s2 + 0x14;
        if (bVar1 == 0) {
          pbVar4 = __s2 + 0x13;
        }
        this->filePtr = (char *)pbVar4;
        anim->mRotationType = TCB;
LAB_003e8787:
        local_88.mTime = 0.0;
        local_88.mValue.w = 1.0;
        local_88.mValue.x = 0.0;
        local_88.mValue.y = 0.0;
        local_88.mValue.z = 0.0;
        __position._M_current =
             (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::_M_realloc_insert<aiQuatKey>
                    (local_70,__position,&local_88);
          paVar5 = (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((__position._M_current)->mValue).y = 0.0;
          ((__position._M_current)->mValue).z = 0.0;
          (__position._M_current)->mTime = 0.0;
          ((__position._M_current)->mValue).w = 1.0;
          ((__position._M_current)->mValue).x = 0.0;
          paVar5 = (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
          (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
          super__Vector_impl_data._M_finish = paVar5;
        }
        local_88.mTime = 0.0;
        local_88.mValue._0_8_ = local_88.mValue._0_8_ & 0xffffffff00000000;
        ParseLV4MeshFloatTriple(this,(ai_real *)&local_88,&local_8c);
        ParseLV4MeshFloat(this,&local_90);
        paVar5[-1].mTime = (double)local_8c;
        fVar6 = (float)((ulong)local_88.mTime >> 0x20);
        local_48 = local_88.mTime;
        uStack_40 = 0;
        fVar7 = 1.0 / SQRT(local_88.mValue.w * local_88.mValue.w +
                           SUB84(local_88.mTime,0) * SUB84(local_88.mTime,0) + fVar6 * fVar6);
        local_58 = ZEXT416((uint)fVar7);
        fVar7 = local_88.mValue.w * fVar7;
        fVar6 = local_90 * 0.5;
        local_68 = sinf(fVar6);
        fVar6 = cosf(fVar6);
        paVar5[-1].mValue.w = fVar6;
        paVar5[-1].mValue.x = local_68 * (float)local_58._0_4_ * (float)local_48;
        paVar5[-1].mValue.y = local_68 * (float)local_58._0_4_ * local_48._4_4_;
        paVar5[-1].mValue.z = fVar7 * local_68;
        __s2 = (byte *)this->filePtr;
      }
      else {
LAB_003e874a:
        if (bVar2) goto LAB_003e8787;
      }
      bVar1 = *__s2;
    }
    bVar2 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003e890f;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *CONTROL_ROT_TRACK chunk (Level 3)");
      }
    }
    else {
      if (bVar1 == 0x7d) {
        local_9c = local_9c + -1;
        if (local_9c == 0) {
          this->filePtr = (char *)(__s2 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_003e8911;
        local_9c = local_9c + 1;
      }
LAB_003e890f:
      bVar2 = false;
    }
LAB_003e8911:
    this->bLastWasEndLine = bVar2;
    __s2 = __s2 + 1;
    this->filePtr = (char *)__s2;
  } while( true );
}

Assistant:

void Parser::ParseLV3RotAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the  floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_ROT_SAMPLE" ,18))
            {
                b = true;
                anim.mRotationType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_ROT_KEY" ,22))
            {
                b = true;
                anim.mRotationType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_ROT_KEY" ,19))
            {
                b = true;
                anim.mRotationType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyRotations.push_back(aiQuatKey());
                aiQuatKey& key = anim.akeyRotations.back();
                aiVector3D v;ai_real f;
                ParseLV4MeshFloatTriple(&v.x,iIndex);
                ParseLV4MeshFloat(f);
                key.mTime = (double)iIndex;
                key.mValue = aiQuaternion(v,f);
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_ROT_TRACK");
    }
}